

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

void amrex::BARef::Initialize(void)

{
  PTR_TO_VOID_FUNC unaff_retaddr;
  
  if (initialized == '\0') {
    initialized = '\x01';
  }
  ExecOnFinalize(unaff_retaddr);
  return;
}

Assistant:

void
BARef::Initialize ()
{
    if (!initialized) {
        initialized = true;
#ifdef AMREX_MEM_PROFILING
        MemProfiler::add("BoxArray", std::function<MemProfiler::MemInfo()>
             ([] () -> MemProfiler::MemInfo {
                 return {total_box_bytes, total_box_bytes_hwm};
             }));
        MemProfiler::add("BoxArrayHash", std::function<MemProfiler::MemInfo()>
             ([] () -> MemProfiler::MemInfo {
                 return {total_hash_bytes, total_hash_bytes_hwm};
             }));
        MemProfiler::add("BoxArray Innard", std::function<MemProfiler::NBuildsInfo()>
             ([] () -> MemProfiler::NBuildsInfo {
                 return {numboxarrays, numboxarrays_hwm};
             }));
#endif
    }

    amrex::ExecOnFinalize(BARef::Finalize);
}